

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootindexproxymodel.cpp
# Opt level: O0

bool __thiscall
RootIndexProxyModel::moveRows
          (RootIndexProxyModel *this,QModelIndex *sourceParent,int sourceRow,int count,
          QModelIndex *destinationParent,int destinationChild)

{
  bool bVar1;
  byte bVar2;
  long lVar3;
  long *plVar4;
  QPersistentModelIndex local_d0;
  QModelIndex local_c8;
  undefined1 local_b0 [24];
  QModelIndex destParent;
  QModelIndex local_80;
  undefined1 local_68 [24];
  QModelIndex srcParent;
  RootIndexProxyModelPrivate *d;
  int destinationChild_local;
  QModelIndex *destinationParent_local;
  int count_local;
  int sourceRow_local;
  QModelIndex *sourceParent_local;
  RootIndexProxyModel *this_local;
  
  lVar3 = QAbstractProxyModel::sourceModel();
  if (lVar3 == 0) {
    this_local._7_1_ = false;
  }
  else {
    srcParent.m = (QAbstractItemModel *)d_func(this);
    QModelIndex::QModelIndex((QModelIndex *)(local_68 + 0x10));
    bVar1 = QModelIndex::isValid(sourceParent);
    if (bVar1) {
      (**(code **)(*(long *)this + 400))(&local_80.m,this,sourceParent);
      local_68._16_8_ = local_80.m;
      srcParent.r = local_68._0_4_;
      srcParent.c = local_68._4_4_;
      srcParent.i = local_68._8_8_;
    }
    else {
      QPersistentModelIndex::operator_cast_to_QModelIndex((QPersistentModelIndex *)&destParent.m);
      local_68._16_8_ = destParent.m;
      srcParent._0_8_ = local_80._0_8_;
      srcParent.i = local_80.i;
    }
    QModelIndex::QModelIndex((QModelIndex *)(local_b0 + 0x10));
    bVar1 = QModelIndex::isValid(destinationParent);
    if (bVar1) {
      (**(code **)(*(long *)this + 400))(&local_c8.m,this,destinationParent);
      local_b0._16_8_ = local_c8.m;
      destParent.r = local_b0._0_4_;
      destParent.c = local_b0._4_4_;
      destParent.i = local_b0._8_8_;
    }
    else {
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_d0);
      local_b0._16_8_ = local_d0.d;
      destParent.r = local_c8.r;
      destParent.c = local_c8.c;
      destParent.i = local_c8.i;
    }
    plVar4 = (long *)QAbstractProxyModel::sourceModel();
    bVar2 = (**(code **)(*plVar4 + 0x120))
                      (plVar4,local_68 + 0x10,sourceRow,count,local_b0 + 0x10,destinationChild);
    this_local._7_1_ = (bool)(bVar2 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool RootIndexProxyModel::moveRows(const QModelIndex &sourceParent, int sourceRow, int count, const QModelIndex &destinationParent,
                                   int destinationChild)
{
    Q_ASSERT(!sourceParent.isValid() || sourceParent.model() == this);
    Q_ASSERT(!destinationParent.isValid() || destinationParent.model() == this);
    if (!sourceModel())
        return false;
    Q_D(RootIndexProxyModel);
    QModelIndex srcParent;
    if (sourceParent.isValid())
        srcParent = mapToSource(sourceParent);
    else
        srcParent = d->m_rootIndex;
    QModelIndex destParent;
    if (destinationParent.isValid())
        destParent = mapToSource(destinationParent);
    else
        destParent = d->m_rootIndex;
    return sourceModel()->moveColumns(srcParent, sourceRow, count, destParent, destinationChild);
}